

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::
testGetTransformFeedbackivQueryForInvalidParameterName(ErrorsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_4f0;
  MessageBuilder local_4e0;
  MessageBuilder local_360;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  byte local_29;
  int local_28;
  int iStack_24;
  bool is_ok;
  GLenum error;
  GLint buffer;
  GLuint invalid_parameter_name;
  GLuint xfb;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _invalid_parameter_name = CONCAT44(extraout_var,iVar1);
  buffer = 0;
  (**(code **)(_invalid_parameter_name + 0x408))(1,&buffer);
  dVar2 = (**(code **)(_invalid_parameter_name + 0x800))();
  glu::checkError(dVar2,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x4df);
  error = 0;
  iStack_24 = 0x4cb2f;
  local_28 = 0;
  local_29 = 1;
  (*this->m_gl_getTransformFeedbackiv)(buffer,0,&stack0xffffffffffffffdc);
  local_28 = (**(code **)(_invalid_parameter_name + 0x800))();
  if (local_28 != 0x500) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b0,
                        (char (*) [117])
                        "glGetTransformFeedbackiv called with invalid parameter name had been expected to generate GL_INVALID_ENUM. However, "
                       );
    EVar7 = glu::getErrorStr(local_28);
    local_1e0 = EVar7.m_getName;
    local_1d8 = EVar7.m_value;
    local_1d0[0].m_getName = local_1e0;
    local_1d0[0].m_value = local_1d8;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" was captured.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    local_29 = 0;
  }
  if (iStack_24 != 0x4cb2f) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_360,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_360,
                        (char (*) [110])
                        "glGetTransformFeedbackiv called with invalid parameter name had been expected not to change the given buffer."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_360);
    local_29 = 0;
  }
  while (local_28 = (**(code **)(_invalid_parameter_name + 0x800))(), local_28 != 0) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_4e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_4e0,
                        (char (*) [125])
                        "Warning! glGetTransformFeedbackiv called with invalid parameter name has generated more than one error, The next error was  "
                       );
    EVar7 = glu::getErrorStr(local_28);
    local_4f0.m_getName = EVar7.m_getName;
    local_4f0.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_4f0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4e0);
  }
  (**(code **)(_invalid_parameter_name + 0x488))(1,&buffer);
  dVar2 = (**(code **)(_invalid_parameter_name + 0x800))();
  glu::checkError(dVar2,"glDeleteTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x50e);
  return (bool)(local_29 & 1);
}

Assistant:

bool ErrorsTest::testGetTransformFeedbackivQueryForInvalidParameterName()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating XFB object. */
	glw::GLuint xfb = 0;

	gl.createTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Generating invalid parameter name. */
	glw::GLuint invalid_parameter_name = 0;

	/* Dummy storage. */
	glw::GLint buffer = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Default result. */
	bool is_ok = true;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbackiv(xfb, invalid_parameter_name, &buffer);

	if (GL_INVALID_ENUM != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid parameter name had been "
											   "expected to generate GL_INVALID_ENUM. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv called with invalid parameter name had been "
											   "expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbackiv called with invalid parameter name "
											   "has generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Clean-up. */
	gl.deleteTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTransformFeedbacks have failed");

	return is_ok;
}